

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

CURLMcode add_next_timeout(timeval now,Curl_multi *multi,Curl_easy *d)

{
  time_node *ptVar1;
  curl_llist_element *e_00;
  timeval newer;
  timeval *ptVar2;
  curl_llist *list_00;
  time_t tVar3;
  Curl_tree *pCVar4;
  time_t diff;
  curl_llist_element *n;
  time_node *node;
  curl_llist_element *e;
  curl_llist *list;
  timeval *tv;
  Curl_easy *d_local;
  Curl_multi *multi_local;
  timeval now_local;
  
  ptVar2 = &(d->state).expiretime;
  list_00 = &(d->state).timeoutlist;
  n = (curl_llist_element *)0x0;
  node = (time_node *)list_00->head;
  while (node != (time_node *)0x0) {
    ptVar1 = (time_node *)(node->list).next;
    n = (curl_llist_element *)(node->list).ptr;
    newer.tv_sec = (__time_t)n[1].ptr;
    newer.tv_usec = (__suseconds_t)n[1].prev;
    tVar3 = curlx_tvdiff(newer,now);
    if (0 < tVar3) break;
    Curl_llist_remove(list_00,&node->list,(void *)0x0);
    node = ptVar1;
  }
  e_00 = list_00->head;
  if (e_00 == (curl_llist_element *)0x0) {
    ptVar2->tv_sec = 0;
    (d->state).expiretime.tv_usec = 0;
  }
  else {
    ptVar2->tv_sec = (__time_t)n[1].ptr;
    (d->state).expiretime.tv_usec = (__suseconds_t)n[1].prev;
    Curl_llist_remove(list_00,e_00,(void *)0x0);
    pCVar4 = Curl_splayinsert(*ptVar2,multi->timetree,&(d->state).timenode);
    multi->timetree = pCVar4;
  }
  return CURLM_OK;
}

Assistant:

static CURLMcode add_next_timeout(struct timeval now,
                                  struct Curl_multi *multi,
                                  struct Curl_easy *d)
{
  struct timeval *tv = &d->state.expiretime;
  struct curl_llist *list = &d->state.timeoutlist;
  struct curl_llist_element *e;
  struct time_node *node = NULL;

  /* move over the timeout list for this specific handle and remove all
     timeouts that are now passed tense and store the next pending
     timeout in *tv */
  for(e = list->head; e;) {
    struct curl_llist_element *n = e->next;
    time_t diff;
    node = (struct time_node *)e->ptr;
    diff = curlx_tvdiff(node->time, now);
    if(diff <= 0)
      /* remove outdated entry */
      Curl_llist_remove(list, e, NULL);
    else
      /* the list is sorted so get out on the first mismatch */
      break;
    e = n;
  }
  e = list->head;
  if(!e) {
    /* clear the expire times within the handles that we remove from the
       splay tree */
    tv->tv_sec = 0;
    tv->tv_usec = 0;
  }
  else {
    /* copy the first entry to 'tv' */
    memcpy(tv, &node->time, sizeof(*tv));

    /* remove first entry from list */
    Curl_llist_remove(list, e, NULL);

    /* insert this node again into the splay */
    multi->timetree = Curl_splayinsert(*tv, multi->timetree,
                                       &d->state.timenode);
  }
  return CURLM_OK;
}